

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenMemoryInit(BinaryenModuleRef module,char *segment,BinaryenExpressionRef dest,
                  BinaryenExpressionRef offset,BinaryenExpressionRef size,char *memoryName)

{
  char *size_00;
  BinaryenExpressionRef offset_00;
  BinaryenExpressionRef dest_00;
  MemoryInit *pMVar1;
  Name memory;
  string_view local_50;
  Builder local_40;
  char *local_38;
  char *memoryName_local;
  BinaryenExpressionRef size_local;
  BinaryenExpressionRef offset_local;
  BinaryenExpressionRef dest_local;
  char *segment_local;
  BinaryenModuleRef module_local;
  
  local_38 = memoryName;
  memoryName_local = (char *)size;
  size_local = offset;
  offset_local = dest;
  dest_local = (BinaryenExpressionRef)segment;
  segment_local = (char *)module;
  wasm::Builder::Builder(&local_40,module);
  wasm::Name::Name((Name *)&local_50,(char *)dest_local);
  dest_00 = offset_local;
  offset_00 = size_local;
  size_00 = memoryName_local;
  memory = getMemoryName((BinaryenModuleRef)segment_local,local_38);
  pMVar1 = wasm::Builder::makeMemoryInit
                     (&local_40,(Name)local_50,dest_00,offset_00,(Expression *)size_00,memory);
  return (BinaryenExpressionRef)pMVar1;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryInit(BinaryenModuleRef module,
                                         const char* segment,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef offset,
                                         BinaryenExpressionRef size,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryInit(Name(segment),
                      (Expression*)dest,
                      (Expression*)offset,
                      (Expression*)size,
                      getMemoryName(module, memoryName)));
}